

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_is_valid_var(secp256k1_ge *a)

{
  long in_RDI;
  secp256k1_fe x3;
  secp256k1_fe y2;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  secp256k1_ge *in_stack_ffffffffffffff90;
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_fe *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  secp256k1_ge_verify(in_stack_ffffffffffffff90);
  if (*(int *)(in_RDI + 0x60) == 0) {
    secp256k1_fe_sqr(&in_stack_ffffffffffffff90->x,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    secp256k1_fe_sqr(&in_stack_ffffffffffffff90->x,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    secp256k1_fe_mul(&in_stack_ffffffffffffff90->x,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (secp256k1_fe *)0x112e3c);
    secp256k1_fe_add_int(&in_stack_ffffffffffffff90->x,in_stack_ffffffffffffff8c);
    local_4 = secp256k1_fe_equal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_ge_is_valid_var(const secp256k1_ge *a) {
    secp256k1_fe y2, x3;
    SECP256K1_GE_VERIFY(a);

    if (a->infinity) {
        return 0;
    }
    /* y^2 = x^3 + 7 */
    secp256k1_fe_sqr(&y2, &a->y);
    secp256k1_fe_sqr(&x3, &a->x); secp256k1_fe_mul(&x3, &x3, &a->x);
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    return secp256k1_fe_equal(&y2, &x3);
}